

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reqrep.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *in_RCX;
  char *pcVar5;
  int in_EDX;
  int sock;
  int family;
  int sock_00;
  int family_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int family_01;
  int sock_05;
  int family_02;
  int sock_06;
  int family_03;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  int family_04;
  int sock_11;
  int family_05;
  int sock_12;
  int sock_13;
  int sock_14;
  int family_06;
  int sock_15;
  int family_07;
  int sock_16;
  int sock_17;
  int sock_18;
  int family_08;
  int sock_19;
  int family_09;
  int sock_20;
  int family_10;
  int sock_21;
  int sock_22;
  int sock_23;
  int sock_24;
  int family_11;
  int sock_25;
  int family_12;
  int sock_26;
  int sock_27;
  int sock_28;
  int timeo;
  int resend_ivl;
  char buf [7];
  char local_30 [9];
  undefined1 local_27 [7];
  
  iVar1 = test_socket_impl((char *)0x2a,0x31,in_EDX,(int)in_RCX);
  test_bind_impl((char *)0x2b,iVar1,sock,in_RCX);
  iVar2 = test_socket_impl((char *)0x2c,0x30,family,(int)in_RCX);
  test_connect_impl((char *)0x2d,iVar2,sock_00,in_RCX);
  iVar3 = test_socket_impl((char *)0x2e,0x30,family_00,(int)in_RCX);
  test_connect_impl((char *)0x2f,iVar3,sock_01,in_RCX);
  iVar4 = nn_send(iVar1,"ABC",3);
  if (iVar4 == -1) {
    iVar4 = nn_errno();
    if (iVar4 != 0x9523dfe) goto LAB_00101c47;
    pcVar5 = (char *)0x0;
    iVar4 = nn_recv(iVar2,local_27,7);
    if (iVar4 != -1) goto LAB_00101c4c;
    iVar4 = nn_errno();
    if (iVar4 != 0x9523dfe) goto LAB_00101c4c;
    test_send_impl((char *)0x38,iVar3,0x102117,pcVar5);
    test_recv_impl((char *)0x39,iVar1,0x102117,pcVar5);
    test_send_impl((char *)0x3a,iVar1,0x102117,pcVar5);
    test_recv_impl((char *)0x3b,iVar3,0x102117,pcVar5);
    test_send_impl((char *)0x3d,iVar2,0x102117,pcVar5);
    test_recv_impl((char *)0x3e,iVar1,0x102117,pcVar5);
    test_send_impl((char *)0x3f,iVar1,0x102117,pcVar5);
    test_recv_impl((char *)0x40,iVar2,0x102117,pcVar5);
    test_close_impl((char *)0x42,iVar1,sock_02);
    test_close_impl((char *)0x43,iVar2,sock_03);
    test_close_impl((char *)0x44,iVar3,sock_04);
    iVar1 = test_socket_impl((char *)0x47,0x30,family_01,(int)pcVar5);
    test_bind_impl((char *)0x48,iVar1,sock_05,pcVar5);
    iVar2 = test_socket_impl((char *)0x49,0x31,family_02,(int)pcVar5);
    test_connect_impl((char *)0x4a,iVar2,sock_06,pcVar5);
    iVar3 = test_socket_impl((char *)0x4b,0x31,family_03,(int)pcVar5);
    test_connect_impl((char *)0x4c,iVar3,sock_07,pcVar5);
    test_send_impl((char *)0x4e,iVar1,0x102117,pcVar5);
    test_recv_impl((char *)0x4f,iVar2,0x102117,pcVar5);
    test_send_impl((char *)0x50,iVar2,0x102117,pcVar5);
    test_recv_impl((char *)0x51,iVar1,0x102117,pcVar5);
    test_send_impl((char *)0x53,iVar1,0x102117,pcVar5);
    test_recv_impl((char *)0x54,iVar3,0x102117,pcVar5);
    test_send_impl((char *)0x55,iVar3,0x102117,pcVar5);
    test_recv_impl((char *)0x56,iVar1,0x102117,pcVar5);
    test_close_impl((char *)0x58,iVar3,sock_08);
    test_close_impl((char *)0x59,iVar2,sock_09);
    test_close_impl((char *)0x5a,iVar1,sock_10);
    iVar1 = test_socket_impl((char *)0x5d,0x31,family_04,(int)pcVar5);
    test_bind_impl((char *)0x5e,iVar1,sock_11,pcVar5);
    iVar2 = test_socket_impl((char *)0x5f,0x30,family_05,(int)pcVar5);
    test_connect_impl((char *)0x60,iVar2,sock_12,pcVar5);
    pcVar5 = local_30 + 4;
    local_30[4] = 'd';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    iVar3 = nn_setsockopt(iVar2,0x30,1,pcVar5,4);
    if (iVar3 != 0) goto LAB_00101c51;
    test_send_impl((char *)0x66,iVar2,0x102117,pcVar5);
    test_recv_impl((char *)0x67,iVar1,0x102117,pcVar5);
    test_recv_impl((char *)0x69,iVar1,0x102117,pcVar5);
    test_close_impl((char *)0x6b,iVar2,sock_13);
    test_close_impl((char *)0x6c,iVar1,sock_14);
    iVar1 = test_socket_impl((char *)0x71,0x30,family_06,(int)pcVar5);
    test_connect_impl((char *)0x72,iVar1,sock_15,pcVar5);
    test_send_impl((char *)0x73,iVar1,0x102117,pcVar5);
    iVar2 = test_socket_impl((char *)0x75,0x31,family_07,(int)pcVar5);
    test_bind_impl((char *)0x76,iVar2,sock_16,pcVar5);
    pcVar5 = local_30;
    local_30[0] = -0x38;
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    iVar3 = nn_setsockopt(iVar2,0,5,pcVar5,4);
    if (iVar3 != 0) goto LAB_00101c56;
    test_recv_impl((char *)0x7b,iVar2,0x102117,pcVar5);
    test_close_impl((char *)0x7d,iVar1,sock_17);
    test_close_impl((char *)0x7e,iVar2,sock_18);
    iVar1 = test_socket_impl((char *)0x83,0x30,family_08,(int)pcVar5);
    test_bind_impl((char *)0x84,iVar1,sock_19,pcVar5);
    iVar2 = test_socket_impl((char *)0x85,0x31,family_09,(int)pcVar5);
    test_connect_impl((char *)0x86,iVar2,sock_20,pcVar5);
    iVar3 = test_socket_impl((char *)0x87,0x31,family_10,(int)pcVar5);
    test_connect_impl((char *)0x88,iVar3,sock_21,pcVar5);
    local_30[0] = -0x38;
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    iVar4 = nn_setsockopt(iVar2,0,5,local_30,4);
    if (iVar4 == 0) {
      pcVar5 = local_30;
      iVar4 = nn_setsockopt(iVar3,0,5,pcVar5,4);
      if (iVar4 == 0) {
        test_send_impl((char *)0x92,iVar1,0x102117,pcVar5);
        test_recv_impl((char *)0x94,iVar2,0x102117,pcVar5);
        test_close_impl((char *)0x96,iVar2,sock_22);
        test_recv_impl((char *)0x98,iVar3,0x102117,pcVar5);
        test_send_impl((char *)0x9a,iVar3,0x102159,pcVar5);
        test_recv_impl((char *)0x9b,iVar1,0x102159,pcVar5);
        test_close_impl((char *)0x9e,iVar1,sock_23);
        test_close_impl((char *)0x9f,iVar3,sock_24);
        iVar1 = test_socket_impl((char *)0xa3,0x30,family_11,(int)pcVar5);
        test_connect_impl((char *)0xa4,iVar1,sock_25,pcVar5);
        test_send_impl((char *)0xa5,iVar1,0x102117,pcVar5);
        test_send_impl((char *)0xa6,iVar1,0x10215f,pcVar5);
        iVar2 = test_socket_impl((char *)0xa8,0x31,family_12,(int)pcVar5);
        test_bind_impl((char *)0xa9,iVar2,sock_26,pcVar5);
        local_30[0] = 'd';
        local_30[1] = '\0';
        local_30[2] = '\0';
        local_30[3] = '\0';
        test_recv_impl((char *)0xae,iVar2,0x10215f,pcVar5);
        test_close_impl((char *)0xb0,iVar1,sock_27);
        test_close_impl((char *)0xb1,iVar2,sock_28);
        return 0;
      }
      goto LAB_00101c60;
    }
  }
  else {
LAB_00101c47:
    main_cold_1();
LAB_00101c4c:
    main_cold_2();
LAB_00101c51:
    main_cold_3();
LAB_00101c56:
    main_cold_4();
  }
  main_cold_5();
LAB_00101c60:
  main_cold_6();
}

Assistant:

int main ()
{
    int rc;
    int rep1;
    int rep2;
    int req1;
    int req2;
    int resend_ivl;
    char buf [7];
    int timeo;

    /*  Test req/rep with full socket types. */
    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    req2 = test_socket (AF_SP, NN_REQ);
    test_connect (req2, SOCKET_ADDRESS);

    /*  Check invalid sequence of sends and recvs. */
    rc = nn_send (rep1, "ABC", 3, 0);
    nn_assert (rc == -1 && nn_errno () == EFSM);
    rc = nn_recv (req1, buf, sizeof (buf), 0);
    nn_assert (rc == -1 && nn_errno () == EFSM);

    /*  Check fair queueing the requests. */
    test_send (req2, "ABC");
    test_recv (rep1, "ABC");
    test_send (rep1, "ABC");
    test_recv (req2, "ABC");

    test_send (req1, "ABC");
    test_recv (rep1, "ABC");
    test_send (rep1, "ABC");
    test_recv (req1, "ABC");

    test_close (rep1);
    test_close (req1);
    test_close (req2);

    /*  Check load-balancing of requests. */
    req1 = test_socket (AF_SP, NN_REQ);
    test_bind (req1, SOCKET_ADDRESS);
    rep1 = test_socket (AF_SP, NN_REP);
    test_connect (rep1, SOCKET_ADDRESS);
    rep2 = test_socket (AF_SP, NN_REP);
    test_connect (rep2, SOCKET_ADDRESS);

    test_send (req1, "ABC");
    test_recv (rep1, "ABC");
    test_send (rep1, "ABC");
    test_recv (req1, "ABC");

    test_send (req1, "ABC");
    test_recv (rep2, "ABC");
    test_send (rep2, "ABC");
    test_recv (req1, "ABC");

    test_close (rep2);
    test_close (rep1);
    test_close (req1);

    /*  Test re-sending of the request. */
    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    resend_ivl = 100;
    rc = nn_setsockopt (req1, NN_REQ, NN_REQ_RESEND_IVL,
        &resend_ivl, sizeof (resend_ivl));
    errno_assert (rc == 0);

    test_send (req1, "ABC");
    test_recv (rep1, "ABC");
    /*  The following waits for request to be resent  */
    test_recv (rep1, "ABC");

    test_close (req1);
    test_close (rep1);

    /*  Check sending a request when the peer is not available. (It should
        be sent immediatelly when the peer comes online rather than relying
        on the resend algorithm. */
    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    test_send (req1, "ABC");

    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    timeo = 200;
    rc = nn_setsockopt (rep1, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    errno_assert (rc == 0);
    test_recv (rep1, "ABC");

    test_close (req1);
    test_close (rep1);

    /*  Check removing socket request sent to (It should
        be sent immediatelly to other peer rather than relying
        on the resend algorithm). */
    req1 = test_socket (AF_SP, NN_REQ);
    test_bind (req1, SOCKET_ADDRESS);
    rep1 = test_socket (AF_SP, NN_REP);
    test_connect (rep1, SOCKET_ADDRESS);
    rep2 = test_socket (AF_SP, NN_REP);
    test_connect (rep2, SOCKET_ADDRESS);

    timeo = 200;
    rc = nn_setsockopt (rep1, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    errno_assert (rc == 0);
    rc = nn_setsockopt (rep2, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    errno_assert (rc == 0);

    test_send (req1, "ABC");
    /*  We got request through rep1  */
    test_recv (rep1, "ABC");
    /*  But instead replying we simulate crash  */
    test_close (rep1);
    /*  The rep2 should get request immediately  */
    test_recv (rep2, "ABC");
    /*  Let's check it's delivered well  */
    test_send (rep2, "REPLY");
    test_recv (req1, "REPLY");


    test_close (req1);
    test_close (rep2);

    /*  Test cancelling delayed request  */

    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    test_send (req1, "ABC");
    test_send (req1, "DEF");

    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    timeo = 100;
//    rc = nn_setsockopt (rep1, NN_SOL_SOCKET, NN_RCVTIMEO,
//       &timeo, sizeof (timeo));
//    errno_assert (rc == 0);
    test_recv (rep1, "DEF");

    test_close (req1);
    test_close (rep1);

    return 0;
}